

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
                   char (*args) [6],int *args_1,char (*args_2) [4],int *args_3,char (*args_4) [2])

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  pcVar2 = (arg->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + arg->_M_string_length);
  StringBuilder<char[6],int,char_const(&)[4],int,char_const(&)[2]>
            (&local_70,args,args_1,args_2,args_3,args_4);
  uVar4 = 0xf;
  if (local_50 != local_40) {
    uVar4 = local_40[0];
  }
  if (uVar4 < local_70._M_string_length + local_48) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar5 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_48 <= (ulong)uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_0011e06f;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_0011e06f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar5 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}